

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean.c
# Opt level: O3

BoolExpr * BO_less_or_equal(List *ls)

{
  ListStruct *pLVar1;
  ListStruct *pLVar2;
  char *fmt;
  
  pLVar1 = ls->cdr;
  if (((pLVar1 == (ListStruct *)0x0) || (pLVar2 = pLVar1->cdr, pLVar2 == (ListStruct *)0x0)) ||
     (pLVar2->cdr != (ListStruct *)0x0)) {
    fmt = "<= takes two arguments.\n";
  }
  else {
    if (((pLVar1->token).type == TOK_NUMBER) && ((pLVar2->token).type == TOK_NUMBER)) {
      if ((pLVar1->token).u.n <= (pLVar2->token).u.n) {
        return &true_bool_expr;
      }
      return &false_bool_expr;
    }
    fmt = "<= can only be used to compare numerical quantities!\n";
  }
  parse_error(ls,fmt);
  return &false_bool_expr;
}

Assistant:

static BoolExpr *
BO_less_or_equal (const List *ls)
{
  if (ls->cdr == NULL || CDDR (ls) == NULL || CDDDR (ls) != NULL)
    {
      parse_error (ls, "<= takes two arguments.\n");
      return &false_bool_expr;  /* default = FALSE */
    }
  if (ls->cdr->token.type != TOK_NUMBER || CDDR (ls)->token.type != TOK_NUMBER)
    {
      parse_error (ls,
		   "<= can only be used to compare numerical quantities!\n");
      return &false_bool_expr;  /* default = FALSE */
    }

  return (ls->cdr->token.u.n <= CDDR (ls)->token.u.n)
    ? &true_bool_expr : &false_bool_expr;
}